

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

bool Fossilize::pipelineCreationIsNonBlocking<VkGraphicsPipelineCreateInfo>
               (VkGraphicsPipelineCreateInfo *info)

{
  VkPipelineCreateFlags2KHR VVar1;
  void *pvVar2;
  void *pvVar3;
  VkPipelineBinaryInfoKHR *binaries;
  VkPipelineLibraryCreateInfoKHR *libraries;
  VkPipelineCreateFlags2KHR flags;
  VkGraphicsPipelineCreateInfo *info_local;
  
  VVar1 = getEffectivePipelineFlags<VkGraphicsPipelineCreateInfo>(info);
  pvVar2 = findpNext(info->pNext,VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR);
  pvVar3 = findpNext(info->pNext,VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR);
  if ((pvVar3 == (void *)0x0) || (*(int *)((long)pvVar3 + 0x10) == 0)) {
    if ((pvVar2 == (void *)0x0) || ((*(int *)((long)pvVar2 + 0x10) == 0 || ((VVar1 & 0x400) != 0))))
    {
      info_local._7_1_ = (VVar1 & 0x100) != 0;
    }
    else {
      info_local._7_1_ = true;
    }
  }
  else {
    info_local._7_1_ = true;
  }
  return info_local._7_1_;
}

Assistant:

static bool pipelineCreationIsNonBlocking(const T &info)
{
	auto flags = getEffectivePipelineFlags(info);

	auto *libraries = static_cast<const VkPipelineLibraryCreateInfoKHR *>(
			findpNext(info.pNext, VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR));

	auto *binaries = static_cast<const VkPipelineBinaryInfoKHR *>(
			findpNext(info.pNext, VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR));

	// Creating pipelines from binaries are always non-blocking.
	if (binaries && binaries->binaryCount)
		return true;

	// Fast link pipelines are expected to be non-blocking always, and at least RADV does not cache it.
	// Don't bother checking if this PSO is in cache, since there's no reason for it to be.
	if (libraries && libraries->libraryCount && (flags & VK_PIPELINE_CREATE_LINK_TIME_OPTIMIZATION_BIT_EXT) == 0)
		return true;

	return (flags & VK_PIPELINE_CREATE_2_FAIL_ON_PIPELINE_COMPILE_REQUIRED_BIT_KHR) != 0;
}